

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool roaring_uint32_iterator_move_equalorlarger(roaring_uint32_iterator_t *it,uint32_t val)

{
  _Bool _Var1;
  uint16_t uVar2;
  uint uVar3;
  roaring_container_iterator_t rVar4;
  ulong in_RAX;
  uint16_t value;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  uVar3 = ra_get_index(&it->parent->high_low_container,(uint16_t)(val >> 0x10));
  if ((int)uVar3 < 0) {
    uVar3 = ~uVar3;
  }
  else {
    uVar2 = container_maximum((it->parent->high_low_container).containers[uVar3],
                              (it->parent->high_low_container).typecodes[uVar3]);
    if ((val & 0xffff) <= (uint)uVar2) {
      it->container_index = uVar3;
      _Var1 = iter_new_container_partial_init(it);
      if (_Var1) {
        uStack_28 = uStack_28 & 0xffffffffffff;
        rVar4 = container_init_iterator
                          (it->container,it->typecode,(uint16_t *)((long)&uStack_28 + 6));
        (it->container_it).index = rVar4.index;
        _Var1 = container_iterator_lower_bound
                          (it->container,it->typecode,&it->container_it,
                           (uint16_t *)((long)&uStack_28 + 6),(uint16_t)val);
        if (_Var1) {
          it->current_value = (uint)uStack_28._6_2_ | it->highbits;
        }
      }
      else {
        _Var1 = false;
      }
      goto LAB_00106baa;
    }
    uVar3 = uVar3 + 1;
  }
  it->container_index = uVar3;
  _Var1 = loadfirstvalue(it);
LAB_00106baa:
  it->has_value = _Var1;
  return _Var1;
}

Assistant:

bool roaring_uint32_iterator_move_equalorlarger(roaring_uint32_iterator_t *it,
                                                uint32_t val) {
    uint16_t hb = val >> 16;
    const int i = ra_get_index(&it->parent->high_low_container, hb);
    if (i >= 0) {
        uint32_t lowvalue =
            container_maximum(it->parent->high_low_container.containers[i],
                              it->parent->high_low_container.typecodes[i]);
        uint16_t lb = val & 0xFFFF;
        if (lowvalue < lb) {
            // will have to load first value of next container
            it->container_index = i + 1;
        } else {
            // the value is necessarily within the range of the container
            it->container_index = i;
            it->has_value = loadfirstvalue_largeorequal(it, val);
            return it->has_value;
        }
    } else {
        // there is no matching, so we are going for the next container
        it->container_index = -i - 1;
    }
    it->has_value = loadfirstvalue(it);
    return it->has_value;
}